

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderCreateInfoWrapper::ShaderCreateInfoWrapper
          (ShaderCreateInfoWrapper *this,ShaderCreateInfo *ShaderCI,IMemoryAllocator *RawAllocator)

{
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *this_00;
  uint uVar1;
  IShaderSourceInputStreamFactory *pIVar2;
  void *pvVar3;
  size_t sVar4;
  Char *pCVar5;
  void *__dest;
  ShaderMacro *__s;
  pointer __p;
  char (*pacVar6) [79];
  size_t alignment;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  string msg;
  FixedLinearAllocator Allocator;
  string local_a8;
  FixedLinearAllocator local_88;
  
  memcpy(this,ShaderCI,0x98);
  pIVar2 = ShaderCI->pShaderSourceStreamFactory;
  (this->m_SourceFactory).m_pObject = pIVar2;
  if (pIVar2 != (IShaderSourceInputStreamFactory *)0x0) {
    (*(pIVar2->super_IObject)._vptr_IObject[1])();
  }
  this_00 = &this->m_pRawMemory;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  local_88.m_ReservedSize = 0;
  local_88.m_CurrAlignment = 0;
  local_88.m_pDataStart = (uint8_t *)0x0;
  local_88.m_pCurrPtr = (uint8_t *)0x0;
  local_88.m_DbgCurrAllocation = 0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.m_DbgUsingExternalMemory = false;
  local_88.m_pAllocator = RawAllocator;
  FixedLinearAllocator::AddSpaceForString(&local_88,ShaderCI->EntryPoint,0);
  FixedLinearAllocator::AddSpaceForString
            (&local_88,(ShaderCI->Desc).super_DeviceObjectAttribs.Name,0);
  FixedLinearAllocator::AddSpaceForString(&local_88,(ShaderCI->Desc).CombinedSamplerSuffix,0);
  FixedLinearAllocator::AddSpaceForString(&local_88,ShaderCI->GLSLExtensions,0);
  FixedLinearAllocator::AddSpaceForString(&local_88,ShaderCI->WebGPUEmulatedArrayIndexSuffix,0);
  if ((ShaderCI->ByteCode == (void *)0x0) || (sVar8 = (ShaderCI->field_4).SourceLength, sVar8 == 0))
  {
    if (ShaderCI->Source != (Char *)0x0) {
      FixedLinearAllocator::AddSpaceForString
                (&local_88,ShaderCI->Source,(ShaderCI->field_4).SourceLength);
      goto LAB_006eda92;
    }
    if ((ShaderCI->FilePath == (char *)0x0) ||
       (ShaderCI->pShaderSourceStreamFactory == (IShaderSourceInputStreamFactory *)0x0)) {
      LogError<true,char[93]>
                (false,"ShaderCreateInfoWrapper",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ShaderBase.cpp"
                 ,0x3c,(char (*) [93])
                       "Shader create info must contain Source, Bytecode or FilePath with pShaderSourceStreamFactory"
                );
      goto LAB_006eda92;
    }
    sVar4 = strlen(ShaderCI->FilePath);
    sVar8 = sVar4 + 1;
    alignment = 1;
  }
  else {
    alignment = 4;
  }
  FixedLinearAllocator::AddSpace(&local_88,sVar8,alignment);
LAB_006eda92:
  uVar1 = (ShaderCI->Macros).Count;
  if (uVar1 != 0 && (ShaderCI->Macros).Elements != (ShaderMacro *)0x0) {
    FixedLinearAllocator::AddSpace(&local_88,(ulong)uVar1 << 4,8);
    if ((ShaderCI->Macros).Count != 0) {
      lVar9 = 0;
      uVar7 = 0;
      do {
        FixedLinearAllocator::AddSpaceForString
                  (&local_88,*(Char **)((long)&((ShaderCI->Macros).Elements)->Name + lVar9),0);
        FixedLinearAllocator::AddSpaceForString
                  (&local_88,*(Char **)((long)&((ShaderCI->Macros).Elements)->Definition + lVar9),0)
        ;
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar7 < (ShaderCI->Macros).Count);
    }
  }
  FixedLinearAllocator::Reserve(&local_88);
  local_88.m_pAllocator = (IMemoryAllocator *)0x0;
  local_a8._M_string_length = 0;
  pvVar3 = (this->m_pRawMemory)._M_t.
           super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t
           .super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = local_88.m_pDataStart;
  pacVar6 = (char (*) [79])local_88.m_pDataStart;
  local_a8._M_dataplus._M_p = (pointer)RawAllocator;
  if (pvVar3 == (void *)0x0) {
    (this_00->_M_t).
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
    _M_head_impl = (STDDeleter<void,_Diligent::IMemoryAllocator>)RawAllocator;
  }
  else {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)this_00,pvVar3);
    (this_00->_M_t).
    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
    super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
    _M_head_impl = (STDDeleter<void,_Diligent::IMemoryAllocator>)local_a8._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    if ((void *)local_a8._M_string_length != (void *)0x0) {
      STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&local_a8,
                 (void *)local_a8._M_string_length);
    }
  }
  pCVar5 = FixedLinearAllocator::CopyString(&local_88,ShaderCI->EntryPoint,0);
  (this->m_CreateInfo).EntryPoint = pCVar5;
  pCVar5 = FixedLinearAllocator::CopyString
                     (&local_88,(ShaderCI->Desc).super_DeviceObjectAttribs.Name,0);
  (this->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name = pCVar5;
  pCVar5 = FixedLinearAllocator::CopyString(&local_88,(ShaderCI->Desc).CombinedSamplerSuffix,0);
  (this->m_CreateInfo).Desc.CombinedSamplerSuffix = pCVar5;
  pCVar5 = FixedLinearAllocator::CopyString(&local_88,ShaderCI->GLSLExtensions,0);
  (this->m_CreateInfo).GLSLExtensions = pCVar5;
  pCVar5 = FixedLinearAllocator::CopyString(&local_88,ShaderCI->WebGPUEmulatedArrayIndexSuffix,0);
  (this->m_CreateInfo).WebGPUEmulatedArrayIndexSuffix = pCVar5;
  if ((this->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name == (Char *)0x0) {
    (this->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name = "";
  }
  pvVar3 = ShaderCI->ByteCode;
  if ((pvVar3 == (void *)0x0) || (sVar8 = (ShaderCI->field_4).SourceLength, sVar8 == 0)) {
    if (ShaderCI->Source == (char *)0x0) {
      pCVar5 = ShaderCI->FilePath;
      if ((pCVar5 == (Char *)0x0) ||
         (ShaderCI->pShaderSourceStreamFactory == (IShaderSourceInputStreamFactory *)0x0)) {
        FormatString<char[26],char[79]>
                  (&local_a8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ShaderCI.FilePath != nullptr && ShaderCI.pShaderSourceStreamFactory != nullptr",
                   pacVar6);
        DebugAssertionFailed
                  (local_a8._M_dataplus._M_p,"ShaderCreateInfoWrapper",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ShaderBase.cpp"
                   ,0x62);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        pCVar5 = ShaderCI->FilePath;
      }
      pCVar5 = FixedLinearAllocator::CopyString(&local_88,pCVar5,0);
      (this->m_CreateInfo).FilePath = pCVar5;
    }
    else {
      pCVar5 = FixedLinearAllocator::CopyString
                         (&local_88,ShaderCI->Source,(ShaderCI->field_4).SourceLength);
      (this->m_CreateInfo).Source = pCVar5;
      (this->m_CreateInfo).field_4 = ShaderCI->field_4;
    }
  }
  else {
    __dest = FixedLinearAllocator::Allocate(&local_88,sVar8,4);
    memcpy(__dest,pvVar3,sVar8);
    (this->m_CreateInfo).ByteCode = __dest;
  }
  uVar1 = (ShaderCI->Macros).Count;
  if (uVar1 != 0 && (ShaderCI->Macros).Elements != (ShaderMacro *)0x0) {
    sVar8 = (ulong)uVar1 << 4;
    __s = (ShaderMacro *)FixedLinearAllocator::Allocate(&local_88,sVar8,8);
    memset(__s,0,sVar8);
    (this->m_CreateInfo).Macros.Elements = __s;
    if ((ShaderCI->Macros).Count != 0) {
      lVar9 = 0;
      uVar7 = 0;
      do {
        pCVar5 = FixedLinearAllocator::CopyString
                           (&local_88,*(char **)((long)&((ShaderCI->Macros).Elements)->Name + lVar9)
                            ,0);
        *(Char **)((long)&__s->Name + lVar9) = pCVar5;
        pCVar5 = FixedLinearAllocator::CopyString
                           (&local_88,
                            *(char **)((long)&((ShaderCI->Macros).Elements)->Definition + lVar9),0);
        *(Char **)((long)&__s->Definition + lVar9) = pCVar5;
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar7 < (ShaderCI->Macros).Count);
    }
  }
  FixedLinearAllocator::~FixedLinearAllocator(&local_88);
  return;
}

Assistant:

ShaderCreateInfoWrapper::ShaderCreateInfoWrapper(const ShaderCreateInfo& ShaderCI,
                                                 IMemoryAllocator&       RawAllocator) noexcept(false) :
    m_CreateInfo{ShaderCI},
    m_SourceFactory{ShaderCI.pShaderSourceStreamFactory}
{
    FixedLinearAllocator Allocator{RawAllocator};

    Allocator.AddSpaceForString(ShaderCI.EntryPoint);
    Allocator.AddSpaceForString(ShaderCI.Desc.Name);
    Allocator.AddSpaceForString(ShaderCI.Desc.CombinedSamplerSuffix);
    Allocator.AddSpaceForString(ShaderCI.GLSLExtensions);
    Allocator.AddSpaceForString(ShaderCI.WebGPUEmulatedArrayIndexSuffix);

    if (ShaderCI.ByteCode && ShaderCI.ByteCodeSize > 0)
    {
        Allocator.AddSpace(ShaderCI.ByteCodeSize, alignof(Uint32));
    }
    else if (ShaderCI.Source != nullptr)
    {
        Allocator.AddSpaceForString(ShaderCI.Source, ShaderCI.SourceLength);
    }
    else if (ShaderCI.FilePath != nullptr && ShaderCI.pShaderSourceStreamFactory != nullptr)
    {
        Allocator.AddSpaceForString(ShaderCI.FilePath);
    }
    else
    {
        LOG_ERROR_AND_THROW("Shader create info must contain Source, Bytecode or FilePath with pShaderSourceStreamFactory");
    }

    if (ShaderCI.Macros)
    {
        Allocator.AddSpace<ShaderMacro>(ShaderCI.Macros.Count);

        for (size_t i = 0; i < ShaderCI.Macros.Count; ++i)
        {
            Allocator.AddSpaceForString(ShaderCI.Macros[i].Name);
            Allocator.AddSpaceForString(ShaderCI.Macros[i].Definition);
        }
    }

    Allocator.Reserve();

    m_pRawMemory = decltype(m_pRawMemory){Allocator.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

    m_CreateInfo.EntryPoint                     = Allocator.CopyString(ShaderCI.EntryPoint);
    m_CreateInfo.Desc.Name                      = Allocator.CopyString(ShaderCI.Desc.Name);
    m_CreateInfo.Desc.CombinedSamplerSuffix     = Allocator.CopyString(ShaderCI.Desc.CombinedSamplerSuffix);
    m_CreateInfo.GLSLExtensions                 = Allocator.CopyString(ShaderCI.GLSLExtensions);
    m_CreateInfo.WebGPUEmulatedArrayIndexSuffix = Allocator.CopyString(ShaderCI.WebGPUEmulatedArrayIndexSuffix);

    if (m_CreateInfo.Desc.Name == nullptr)
        m_CreateInfo.Desc.Name = "";

    if (ShaderCI.ByteCode && ShaderCI.ByteCodeSize > 0)
    {
        m_CreateInfo.ByteCode = Allocator.Copy(ShaderCI.ByteCode, ShaderCI.ByteCodeSize, alignof(Uint32));
    }
    else if (ShaderCI.Source != nullptr)
    {
        m_CreateInfo.Source       = Allocator.CopyString(ShaderCI.Source, ShaderCI.SourceLength);
        m_CreateInfo.SourceLength = ShaderCI.SourceLength;
    }
    else
    {
        VERIFY_EXPR(ShaderCI.FilePath != nullptr && ShaderCI.pShaderSourceStreamFactory != nullptr);
        m_CreateInfo.FilePath = Allocator.CopyString(ShaderCI.FilePath);
    }

    if (ShaderCI.Macros)
    {
        ShaderMacro* pMacros         = Allocator.ConstructArray<ShaderMacro>(ShaderCI.Macros.Count);
        m_CreateInfo.Macros.Elements = pMacros;
        for (size_t i = 0; i < ShaderCI.Macros.Count; ++i)
        {
            pMacros[i].Name       = Allocator.CopyString(ShaderCI.Macros[i].Name);
            pMacros[i].Definition = Allocator.CopyString(ShaderCI.Macros[i].Definition);
        }
    }
}